

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_tracing_libapi.cpp
# Opt level: O2

ze_result_t zelTracerSetPrologues(zel_tracer_handle_t hTracer,zel_core_callbacks_t *pCoreCbs)

{
  ze_result_t zVar1;
  
  if ((ze_lib::destruction == '\0') && (*(code **)(ze_lib::context + 0x38) != (code *)0x0)) {
    zVar1 = (**(code **)(ze_lib::context + 0x38))();
    return zVar1;
  }
  return ZE_RESULT_ERROR_UNINITIALIZED;
}

Assistant:

ze_result_t ZE_APICALL
zelTracerSetPrologues(
    zel_tracer_handle_t hTracer,                ///< [in] handle of the tracer
    zel_core_callbacks_t* pCoreCbs              ///< [in] pointer to table of 'core' callback function pointers
    )
{
    if(ze_lib::destruction)
        return ZE_RESULT_ERROR_UNINITIALIZED;
    auto pfnSetPrologues = ze_lib::context->zelTracingDdiTable.Tracer.pfnSetPrologues;
    if( nullptr == pfnSetPrologues )
        return ZE_RESULT_ERROR_UNINITIALIZED;

    return pfnSetPrologues( hTracer, pCoreCbs );
}